

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewPrefixCursor(SQLiteBatch *this,Span<const_std::byte> prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wallet *pwVar2;
  _func_int *p_Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  runtime_error *this_00;
  long in_RCX;
  byte *__first;
  int unaff_EBP;
  char *pcVar9;
  string *in_R9;
  size_t sVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  vector<std::byte,_std::allocator<std::byte>_> end_range;
  vector<std::byte,_std::allocator<std::byte>_> start_range;
  undefined8 local_90;
  _func_int **local_88;
  _func_int **local_80;
  long local_78;
  void *local_70;
  long local_68;
  long local_60;
  string local_58;
  long local_38;
  
  __first = (byte *)prefix.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(undefined8 *)(prefix.m_data + 8) + 200) == 0) {
    (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
LAB_001c2ba1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
              )(__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
                )this;
    }
  }
  else {
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_70,__first,__first + in_RCX,
               (allocator_type *)&local_58);
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_88,__first,__first + in_RCX,
               (allocator_type *)&local_58);
    pp_Var6 = local_80;
    while (pp_Var6 != local_88) {
      if (*(char *)((long)pp_Var6 + -1) != -1) {
        *(char *)((long)pp_Var6 + -1) = *(char *)((long)pp_Var6 + -1) + '\x01';
        break;
      }
      pp_Var6 = (_func_int **)((long)pp_Var6 + -1);
      *(undefined1 *)pp_Var6 = 0;
    }
    if ((pp_Var6 == local_88) && (local_80 != local_88)) {
      local_80 = local_88;
    }
    pp_Var6 = local_88;
    pp_Var7 = (_func_int **)operator_new(0x40);
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::_M_create_storage
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&local_58,
               local_68 - (long)local_70);
    _Var4._M_p = local_58._M_dataplus._M_p;
    sVar10 = local_68 - (long)local_70;
    if (sVar10 != 0) {
      memmove(local_58._M_dataplus._M_p,local_70,sVar10);
    }
    local_58._M_string_length = (size_type)(_Var4._M_p + sVar10);
    uVar11 = (long)local_80 - (long)local_88;
    if (uVar11 == 0) {
      p_Var8 = (_func_int *)0x0;
      sVar10 = 0;
LAB_001c29fd:
      if (local_80 == local_88) {
        pcVar9 = "SELECT key, value FROM main WHERE key >= ?";
      }
      else {
        memmove(p_Var8,local_88,sVar10);
        pcVar9 = "SELECT key, value FROM main WHERE key >= ? AND key < ?";
      }
      *pp_Var7 = (_func_int *)&PTR__SQLiteCursor_006b2678;
      pp_Var6 = pp_Var7 + 1;
      pp_Var7[1] = (_func_int *)0x0;
      *(undefined4 *)(pp_Var7 + 2) = local_58._M_dataplus._M_p._0_4_;
      *(undefined4 *)((long)pp_Var7 + 0x14) = local_58._M_dataplus._M_p._4_4_;
      *(undefined4 *)(pp_Var7 + 3) = (undefined4)local_58._M_string_length;
      *(undefined4 *)((long)pp_Var7 + 0x1c) = local_58._M_string_length._4_4_;
      pp_Var7[4] = (_func_int *)local_58.field_2._M_allocated_capacity;
      pp_Var7[5] = p_Var8;
      pp_Var7[6] = p_Var8 + sVar10;
      pp_Var7[7] = p_Var8 + uVar11;
      unaff_EBP = sqlite3_prepare_v2(*(undefined8 *)(*(undefined8 *)(prefix.m_data + 8) + 200),
                                     pcVar9,0xffffffff,pp_Var6,0);
      if (unaff_EBP == 0) {
        pwVar2 = (wallet *)pp_Var7[1];
        p_Var8 = pp_Var7[2];
        p_Var3 = pp_Var7[3];
        paVar1 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prefix_start","");
        blob.m_size = (size_t)&local_58;
        blob.m_data = (byte *)(p_Var3 + -(long)p_Var8);
        bVar5 = BindBlobToStatement(pwVar2,(sqlite3_stmt *)0x1,(int)p_Var8,blob,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,
                          (ulong)(local_58.field_2._M_allocated_capacity + 1));
        }
        if (bVar5) {
          if (local_88 != local_80) {
            pwVar2 = (wallet *)pp_Var7[1];
            p_Var8 = pp_Var7[5];
            p_Var3 = pp_Var7[6];
            local_58._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prefix_end","");
            blob_00.m_size = (size_t)&local_58;
            blob_00.m_data = (byte *)(p_Var3 + -(long)p_Var8);
            bVar5 = BindBlobToStatement(pwVar2,(sqlite3_stmt *)0x2,(int)p_Var8,blob_00,in_R9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar1) {
              operator_delete(local_58._M_dataplus._M_p,
                              (ulong)(local_58.field_2._M_allocated_capacity + 1));
            }
            if (!bVar5) goto LAB_001c2b5f;
          }
          (this->super_DatabaseBatch)._vptr_DatabaseBatch = pp_Var7;
        }
        else {
LAB_001c2b5f:
          (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
          (**(code **)(*pp_Var7 + 8))(pp_Var7);
        }
        if (local_88 != (_func_int **)0x0) {
          operator_delete(local_88,local_78 - (long)local_88);
        }
        if (local_70 != (void *)0x0) {
          operator_delete(local_70,local_60 - (long)local_70);
        }
        goto LAB_001c2ba1;
      }
    }
    else {
      if (-1 < (long)uVar11) {
        p_Var8 = (_func_int *)operator_new(uVar11);
        sVar10 = (long)local_80 - (long)local_88;
        goto LAB_001c29fd;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001c2d53;
      std::__throw_bad_alloc();
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90 = sqlite3_errstr(unaff_EBP);
    tinyformat::format<char_const*>
              (&local_58,(tinyformat *)"SQLiteDatabase: Failed to setup cursor SQL statement: %s\n",
               (char *)&local_90,(char **)pp_Var6);
    std::runtime_error::runtime_error(this_00,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_001c2d53:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewPrefixCursor(Span<const std::byte> prefix)
{
    if (!m_database.m_db) return nullptr;

    // To get just the records we want, the SQL statement does a comparison of the binary data
    // where the data must be greater than or equal to the prefix, and less than
    // the prefix incremented by one (when interpreted as an integer)
    std::vector<std::byte> start_range(prefix.begin(), prefix.end());
    std::vector<std::byte> end_range(prefix.begin(), prefix.end());
    auto it = end_range.rbegin();
    for (; it != end_range.rend(); ++it) {
        if (*it == std::byte(std::numeric_limits<unsigned char>::max())) {
            *it = std::byte(0);
            continue;
        }
        *it = std::byte(std::to_integer<unsigned char>(*it) + 1);
        break;
    }
    if (it == end_range.rend()) {
        // If the prefix is all 0xff bytes, clear end_range as we won't need it
        end_range.clear();
    }

    auto cursor = std::make_unique<SQLiteCursor>(start_range, end_range);
    if (!cursor) return nullptr;

    const char* stmt_text = end_range.empty() ? "SELECT key, value FROM main WHERE key >= ?" :
                            "SELECT key, value FROM main WHERE key >= ? AND key < ?";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "SQLiteDatabase: Failed to setup cursor SQL statement: %s\n", sqlite3_errstr(res)));
    }

    if (!BindBlobToStatement(cursor->m_cursor_stmt, 1, cursor->m_prefix_range_start, "prefix_start")) return nullptr;
    if (!end_range.empty()) {
        if (!BindBlobToStatement(cursor->m_cursor_stmt, 2, cursor->m_prefix_range_end, "prefix_end")) return nullptr;
    }

    return cursor;
}